

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::EveryHelper<unsigned_long>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              unsigned_long length,Arguments *args,ScriptContext *scriptContext)

{
  ThreadContext *this;
  code *pcVar1;
  double value;
  bool bVar2;
  bool bVar3;
  BOOL BVar4;
  Var pvVar5;
  RecyclableObject *callBackFn;
  undefined4 *puVar6;
  undefined8 uVar7;
  JavascriptMethod p_Var8;
  uint64 uVar9;
  uint64 uVar10;
  long lVar11;
  char16_t *varName;
  ulong uVar12;
  ulong uVar13;
  undefined1 local_88 [8];
  JsReentLock jsReentLock;
  RecyclableObject *local_58;
  
  local_88 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_88)->noJsReentrancy;
  ((ThreadContext *)local_88)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_88,pArr);
  if (((ulong)args->Info & 0xfffffe) == 0) {
LAB_00b98884:
    varName = L"[TypedArray].prototype.every";
    if (typedArrayBase == (TypedArrayBase *)0x0) {
      varName = L"Array.prototype.every";
    }
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec34,varName);
  }
  pvVar5 = Arguments::operator[](args,1);
  bVar2 = JavascriptConversion::IsCallable(pvVar5);
  if (!bVar2) goto LAB_00b98884;
  pvVar5 = Arguments::operator[](args,1);
  callBackFn = VarTo<Js::RecyclableObject>(pvVar5);
  if ((*(uint *)&args->Info & 0xffffff) < 3) {
    local_58 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  else {
    local_58 = (RecyclableObject *)Arguments::operator[](args,2);
  }
  if (pArr == (JavascriptArray *)0x0 && typedArrayBase == (TypedArrayBase *)0x0) {
    bVar2 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(obj);
    if (bVar2) {
      typedArrayBase = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(obj);
      goto LAB_00b9861f;
    }
  }
  else {
LAB_00b9861f:
    if (typedArrayBase != (TypedArrayBase *)0x0) {
      bVar2 = VarIsCorrectType<Js::TypedArrayBase>(typedArrayBase);
      if (!bVar2) {
        bVar2 = VarIsCorrectType<Js::TypedArrayBase>(typedArrayBase);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x22f7,"(VarIsCorrectType(typedArrayBase))",
                                      "VarIsCorrectType(typedArrayBase)");
          if (!bVar2) {
LAB_00b9890f:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar6 = 0;
        }
        Throw::FatalInternalError(-0x7fffbffb);
      }
      uVar13 = (ulong)(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.length;
      if (uVar13 < length) {
        length = uVar13;
      }
      lVar11 = 1000;
      if (length != 0) {
        jsReentLock._24_8_ = typedArrayBase;
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        uVar13 = 0;
        do {
          uVar7 = (**(code **)(*(long *)jsReentLock._24_8_ + 0x390))
                            (jsReentLock._24_8_,uVar13 & 0xffffffff);
          *(undefined1 *)((long)local_88 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          this = scriptContext->threadContext;
          bVar2 = this->reentrancySafeOrHandled;
          this->reentrancySafeOrHandled = true;
          ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
          if (scriptContext->threadContext->noJsReentrancy == true) {
            Throw::FatalJsReentrancyError();
          }
          p_Var8 = RecyclableObject::GetEntryPoint(callBackFn);
          CheckIsExecutable(callBackFn,p_Var8);
          p_Var8 = RecyclableObject::GetEntryPoint(callBackFn);
          if ((int)uVar13 < 0) {
            value = (double)(uVar13 & 0xffffffff);
            uVar9 = NumberUtilities::ToSpecial(value);
            bVar3 = NumberUtilities::IsNan(value);
            if (bVar3) {
              uVar10 = NumberUtilities::ToSpecial(value);
              if (uVar10 != 0xfff8000000000000) {
                uVar10 = NumberUtilities::ToSpecial(value);
                if (uVar10 != 0x7ff8000000000000) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  *puVar6 = 1;
                  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                              ,0xa2,
                                              "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                              ,"We should only produce a NaN with this value");
                  if (!bVar3) goto LAB_00b9890f;
                  *puVar6 = 0;
                }
              }
            }
            uVar12 = uVar9 ^ 0xfffc000000000000;
          }
          else {
            uVar12 = uVar13 + 0x1000000000000;
          }
          pvVar5 = (*p_Var8)(callBackFn,(CallInfo)callBackFn,0x2000004,0,0,0,0,0x2000004,local_58,
                             uVar7,uVar12,jsReentLock._24_8_);
          this->reentrancySafeOrHandled = bVar2;
          JsReentLock::MutateArrayObject((JsReentLock *)local_88);
          *(bool *)((long)local_88 + 0x108) = true;
          BVar4 = JavascriptConversion::ToBoolean(pvVar5,scriptContext);
          if (BVar4 == 0) {
            lVar11 = 0x3f0;
            goto LAB_00b98857;
          }
          uVar13 = uVar13 + 1;
        } while (length != uVar13);
        lVar11 = 1000;
      }
LAB_00b98857:
      pvVar5 = *(Var *)((long)&(((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                               super_JavascriptLibraryBase).super_FinalizableObject.
                               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + lVar11);
      goto LAB_00b98863;
    }
  }
  *(undefined1 *)((long)local_88 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  pvVar5 = EveryObjectHelper<unsigned_long>(obj,length,0,callBackFn,local_58,scriptContext);
LAB_00b98863:
  *(undefined1 *)((long)local_88 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return pvVar5;
}

Assistant:

Var JavascriptArray::EveryHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            // typedArrayBase is only non-null if and only if we came here via the TypedArray entrypoint
            if (typedArrayBase != nullptr)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].prototype.every"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Array.prototype.every"));
            }
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var thisArg = nullptr;


        if (args.Info.Count > 2)
        {
            thisArg = args[2];
        }
        else
        {
            thisArg = scriptContext->GetLibrary()->GetUndefined();
        }

        // If we came from Array.prototype.map and source object is not a JavascriptArray, source could be a TypedArray
        if (typedArrayBase == nullptr && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        Var element = nullptr;
        Var testResult = nullptr;
        if (typedArrayBase)
        {
            AssertAndFailFast(VarIsCorrectType(typedArrayBase));
            uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

            for (uint32 k = 0; k < end; k++)
            {
                // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                element = typedArrayBase->DirectGetItem(k);

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        testResult = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(CallFlags_Value, 4), thisArg,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                typedArrayBase);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                if (!JavascriptConversion::ToBoolean(testResult, scriptContext))
                {
                    return scriptContext->GetLibrary()->GetFalse();
                }
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::EveryObjectHelper<T>(obj, length, 0u, callBackFn, thisArg, scriptContext));
        }

        return scriptContext->GetLibrary()->GetTrue();
    }